

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

bool Catch::TestCaseTracking::operator==(NameAndLocation *lhs,NameAndLocationRef *rhs)

{
  size_t __n;
  char *__s1;
  char *__s2;
  int iVar1;
  
  if ((lhs->location).line != (rhs->location).line) {
    return false;
  }
  __n = (lhs->name)._M_string_length;
  if (((__n == (rhs->name).m_size) &&
      (iVar1 = bcmp((lhs->name)._M_dataplus._M_p,(rhs->name).m_start,__n), iVar1 == 0)) &&
     ((lhs->location).line == (rhs->location).line)) {
    __s1 = (lhs->location).file;
    __s2 = (rhs->location).file;
    if (__s1 != __s2) {
      iVar1 = strcmp(__s1,__s2);
      return iVar1 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool operator==( NameAndLocation const& lhs,
                                NameAndLocationRef const& rhs ) {
            // This is a very cheap check that should have a very high hit rate.
            // If we get to SourceLineInfo::operator==, we will redo it, but the
            // cost of repeating is trivial at that point (we will be paying
            // multiple strcmp/memcmps at that point).
            if ( lhs.location.line != rhs.location.line ) { return false; }
            return StringRef( lhs.name ) == rhs.name &&
                   lhs.location == rhs.location;
        }